

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Maybe<kj::Own<kj::_::Event>_> __thiscall
kj::_::EagerPromiseNodeBase::fire(EagerPromiseNodeBase *this)

{
  char *pcVar1;
  Event *extraout_RDX;
  char *in_RSI;
  Maybe<kj::Own<kj::_::Event>_> MVar2;
  NullableValue<kj::Exception> exception;
  Runnable local_2e0;
  Exception local_2d8;
  Maybe<kj::Exception> local_180;
  
  (**(code **)(**(long **)(in_RSI + 0x38) + 0x10))
            (*(long **)(in_RSI + 0x38),*(undefined8 *)(in_RSI + 0x48));
  local_2e0._vptr_Runnable = (_func_int **)&PTR_run_0064cf98;
  local_2d8.ownFile.content.ptr = in_RSI;
  runCatchingExceptions(&local_180,&local_2e0);
  local_2e0._vptr_Runnable._0_1_ = local_180.ptr.isSet;
  if (local_180.ptr.isSet == true) {
    local_2d8.ownFile.content.ptr = local_180.ptr.field_1.value.ownFile.content.ptr;
    local_2d8.ownFile.content.size_ = local_180.ptr.field_1.value.ownFile.content.size_;
    local_2d8.ownFile.content.disposer = local_180.ptr.field_1.value.ownFile.content.disposer;
    local_180.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_180.ptr.field_1.value.ownFile.content.size_ = 0;
    local_2d8.file = local_180.ptr.field_1.value.file;
    local_2d8.line = local_180.ptr.field_1.value.line;
    local_2d8.type = local_180.ptr.field_1.value.type;
    local_2d8.description.content.ptr = local_180.ptr.field_1.value.description.content.ptr;
    local_2d8.description.content.size_ = local_180.ptr.field_1.value.description.content.size_;
    local_2d8.description.content.disposer =
         local_180.ptr.field_1.value.description.content.disposer;
    local_2d8.context.ptr.disposer = local_180.ptr.field_1.value.context.ptr.disposer;
    local_180.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_180.ptr.field_1.value.description.content.size_ = 0;
    local_2d8.context.ptr.ptr = local_180.ptr.field_1.value.context.ptr.ptr;
    local_180.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2d8.trace,(void *)((long)&local_180.ptr.field_1 + 0x50),0x104);
    Exception::~Exception(&local_180.ptr.field_1.value);
  }
  if (((char)local_2e0._vptr_Runnable == '\x01') &&
     (pcVar1 = *(char **)(in_RSI + 0x48), *pcVar1 == '\0')) {
    *(char **)(pcVar1 + 8) = local_2d8.ownFile.content.ptr;
    *(size_t *)(pcVar1 + 0x10) = local_2d8.ownFile.content.size_;
    *(ArrayDisposer **)(pcVar1 + 0x18) = local_2d8.ownFile.content.disposer;
    local_2d8.ownFile.content.ptr = (char *)0x0;
    local_2d8.ownFile.content.size_ = 0;
    *(char **)(pcVar1 + 0x20) = local_2d8.file;
    *(undefined8 *)(pcVar1 + 0x28) = local_2d8._32_8_;
    *(char **)(pcVar1 + 0x30) = local_2d8.description.content.ptr;
    *(size_t *)(pcVar1 + 0x38) = local_2d8.description.content.size_;
    *(ArrayDisposer **)(pcVar1 + 0x40) = local_2d8.description.content.disposer;
    local_2d8.description.content.ptr = (char *)0x0;
    local_2d8.description.content.size_ = 0;
    *(Disposer **)(pcVar1 + 0x48) = local_2d8.context.ptr.disposer;
    *(Context **)(pcVar1 + 0x50) = local_2d8.context.ptr.ptr;
    local_2d8.context.ptr.ptr = (Context *)0x0;
    memcpy(pcVar1 + 0x58,local_2d8.trace,0x104);
    *pcVar1 = '\x01';
  }
  if ((char)local_2e0._vptr_Runnable == '\x01') {
    Exception::~Exception(&local_2d8);
  }
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(in_RSI + 0x40));
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)0x0;
  (this->super_Event)._vptr_Event = (_func_int **)0x0;
  MVar2.ptr.ptr = extraout_RDX;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<Event>> EagerPromiseNodeBase::fire() {
  dependency->get(resultRef);
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([this]() {
    dependency = nullptr;
  })) {
    resultRef.addException(kj::mv(*exception));
  }

  onReadyEvent.arm();
  return nullptr;
}